

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
nnad::Matrix<double>::Matrix(Matrix<double> *this,int *Lines,int *Columns,int *RandomSeed)

{
  int iVar1;
  allocator_type *__a;
  reference pvVar2;
  uint *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  double temp;
  int i;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  double dVar3;
  int local_38;
  undefined1 local_21;
  uint *local_20;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = *in_RDX;
  __a = (allocator_type *)(long)(*in_RDI * in_RDI[1]);
  __n = &local_21;
  local_20 = in_RCX;
  std::allocator<double>::allocator((allocator<double> *)0x10a35f);
  std::vector<double,_std::allocator<double>_>::vector(in_stack_ffffffffffffffc0,(size_type)__n,__a)
  ;
  std::allocator<double>::~allocator((allocator<double> *)0x10a37f);
  srand(*local_20);
  for (local_38 = 0; local_38 < *in_RDI * in_RDI[1]; local_38 = local_38 + 1) {
    iVar1 = rand();
    while (dVar3 = (double)(iVar1 % 100) * 0.02 + -1.0, dVar3 == 0.0) {
      iVar1 = rand();
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_38);
    *pvVar2 = dVar3;
  }
  return;
}

Assistant:

Matrix(int const& Lines, int const& Columns, int const& RandomSeed = -1):
      _Lines(Lines),
      _Columns(Columns),
      _Matrix(_Lines * _Columns)
    {
      // Initialise random number generator.
      srand(RandomSeed);

      // Fill in the matrix with random numbers distributed in [-1:1]
      for (int i = 0; i < _Lines * _Columns; i++)
        {
          double temp = 2e-2 * ( rand() % 100 ) - 1;
          while(!temp)
            temp = 2e-2 * ( rand() % 100 ) - 1;

          _Matrix[i] = T(temp);
        }
    }